

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.c
# Opt level: O2

ZyanStatus
ZydisStringAppendHexU
          (ZyanString *string,ZyanU64 value,ZyanU8 padding_length,ZyanBool force_leading_number,
          ZyanBool uppercase,ZyanStringView *prefix,ZyanStringView *suffix)

{
  ZyanUSize ZVar1;
  bool bVar2;
  ZyanStatus ZVar3;
  ulong __n;
  int iVar4;
  undefined1 *__s;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  byte bVar11;
  bool bVar12;
  uint local_68;
  
  if ((prefix == (ZyanStringView *)0x0) ||
     (ZVar3 = ZydisStringAppend(string,prefix), -1 < (int)ZVar3)) {
    if (string == (ZyanString *)0x0) {
      __assert_fail("string",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/String.c"
                    ,0xed,
                    "ZyanStatus ZydisStringAppendHexU64(ZyanString *, ZyanU64, ZyanU8, ZyanBool, ZyanBool)"
                   );
    }
    if ((string->vector).allocator != (ZyanAllocator *)0x0) {
      __assert_fail("!string->vector.allocator",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/String.c"
                    ,0xee,
                    "ZyanStatus ZydisStringAppendHexU64(ZyanString *, ZyanU64, ZyanU8, ZyanBool, ZyanBool)"
                   );
    }
    ZVar1 = (string->vector).size;
    uVar8 = (string->vector).capacity - ZVar1;
    ZVar3 = 0x80100009;
    if (padding_length <= uVar8) {
      if (value == 0) {
        bVar11 = 1;
        if (1 < padding_length) {
          bVar11 = padding_length;
        }
        __n = (ulong)bVar11;
        if (uVar8 < __n) {
          return 0x80100009;
        }
        memset((void *)((long)(string->vector).data + (ZVar1 - 1)),0x30,__n);
      }
      else {
        bVar2 = value >> 0x20 == 0;
        uVar7 = (uint)!bVar2;
        pcVar6 = "0123456789ABCDEF";
        if (uppercase == '\0') {
          pcVar6 = "0123456789abcdef";
        }
        bVar11 = (padding_length + bVar2 * '\b') - 0x10;
        iVar4 = uVar7 * 8 + 7;
        iVar10 = uVar7 * 0x20 + 0x1c;
        __n = 0;
        __s = (undefined1 *)0x0;
        while( true ) {
          if ((char)iVar4 < '\0') break;
          uVar9 = value >> ((byte)iVar10 & 0x3f);
          if ((char)__n == '\0') {
            if ((uVar9 & 0xf) != 0) {
              bVar12 = 9 < ((byte)uVar9 & 0xf);
              local_68 = (uint)padding_length;
              bVar2 = (int)local_68 <= iVar4;
              uVar7 = (uint)bVar12;
              if ((uint)(force_leading_number != '\0') <= (uint)bVar12) {
                uVar7 = (uint)(force_leading_number != '\0');
              }
              uVar5 = (uint)bVar2;
              if (uVar7 < bVar2) {
                uVar5 = uVar7;
              }
              if (uVar8 <= (uVar5 + iVar4 & 0xff)) {
                return 0x80100009;
              }
              __s = (undefined1 *)((long)(string->vector).data + (ZVar1 - 1));
              if ((bVar2 && force_leading_number != '\0') && bVar12) {
                *__s = 0x30;
              }
              __n = (ulong)((bVar2 && force_leading_number != '\0') && bVar12);
              if (iVar4 < (int)local_68) {
                memset(__s,0x30,(ulong)bVar11);
                __n = (ulong)bVar11;
              }
              goto LAB_00119bae;
            }
            __n = 0;
          }
          else {
            if (__s == (undefined1 *)0x0) {
              __assert_fail("buffer",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/String.c"
                            ,0x124,
                            "ZyanStatus ZydisStringAppendHexU64(ZyanString *, ZyanU64, ZyanU8, ZyanBool, ZyanBool)"
                           );
            }
LAB_00119bae:
            __s[__n] = pcVar6[(uint)uVar9 & 0xf];
            __n = (ulong)(byte)((char)__n + 1);
          }
          bVar11 = bVar11 + 1;
          iVar4 = iVar4 + -1;
          iVar10 = iVar10 + -4;
        }
      }
      (string->vector).size = __n + ZVar1;
      *(undefined1 *)((long)(string->vector).data + ((__n + ZVar1) - 1)) = 0;
      if (suffix != (ZyanStringView *)0x0) {
        ZVar3 = ZydisStringAppend(string,suffix);
        return ZVar3;
      }
      ZVar3 = 0x100000;
    }
  }
  return ZVar3;
}

Assistant:

ZyanStatus ZydisStringAppendHexU(ZyanString* string, ZyanU64 value, ZyanU8 padding_length,
    ZyanBool force_leading_number, ZyanBool uppercase, const ZyanStringView* prefix,
    const ZyanStringView* suffix)
{
    if (prefix)
    {
        ZYAN_CHECK(ZydisStringAppend(string, prefix));
    }

#if defined(ZYAN_X64) || defined(ZYAN_AARCH64) || defined(ZYAN_PPC64) || defined(ZYAN_RISCV64) || defined(ZYAN_LOONGARCH)
    ZYAN_CHECK(ZydisStringAppendHexU64(string, value, padding_length, force_leading_number,
        uppercase));
#else
    if (value & 0xFFFFFFFF00000000)
    {
        ZYAN_CHECK(ZydisStringAppendHexU64(string, value, padding_length, force_leading_number,
            uppercase));
    }
    else
    {
        ZYAN_CHECK(ZydisStringAppendHexU32(string, (ZyanU32)value, padding_length,
            force_leading_number, uppercase));
    }
#endif

    if (suffix)
    {
        return ZydisStringAppend(string, suffix);
    }
    return ZYAN_STATUS_SUCCESS;
}